

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_xar.c
# Opt level: O1

void test_xar(char *option)

{
  int iVar1;
  mode_t mVar2;
  uint uVar3;
  wchar_t wVar4;
  archive *paVar5;
  void *buff;
  la_ssize_t lVar6;
  time_t tVar7;
  long lVar8;
  char *pcVar9;
  la_int64_t lVar10;
  wchar_t *v2;
  size_t size;
  size_t used;
  void *value;
  char *name;
  archive_entry *ae;
  char buff2 [64];
  size_t local_a0;
  size_t local_98;
  void *local_90;
  char *local_88;
  archive_entry *local_80;
  undefined1 local_78 [72];
  
  paVar5 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                   ,L',',(uint)(paVar5 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_set_format_xar(paVar5);
  if (iVar1 == 0) {
    iVar1 = archive_write_add_filter_none(paVar5);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                     ,L'2',(uint)(iVar1 == 0),"0 == archive_write_add_filter_none(a)",paVar5);
    if (option != (char *)0x0) {
      iVar1 = archive_write_set_options(paVar5,option);
      if (iVar1 != 0) {
        skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                       ,L'5');
        test_skipping("option `%s` is not supported on this platform",option);
        iVar1 = archive_write_free(paVar5);
        wVar4 = L'6';
        goto LAB_00204889;
      }
    }
    buff = malloc(0x5dc);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                     ,L';',(uint)(buff != (void *)0x0),"buff != NULL",(void *)0x0);
    iVar1 = archive_write_open_memory(paVar5,buff,0x5dc,&local_98);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                     ,L'=',(uint)(iVar1 == 0),
                     "0 == archive_write_open_memory(a, buff, buffsize, &used)",paVar5);
    local_80 = archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                     ,L'C',(uint)(local_80 != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_set_atime(local_80,2,0x14);
    archive_entry_set_ctime(local_80,4,0x28);
    archive_entry_set_mtime(local_80,5,0x32);
    archive_entry_copy_pathname(local_80,"file");
    archive_entry_set_mode(local_80,0x81ed);
    archive_entry_set_nlink(local_80,2);
    archive_entry_set_size(local_80,8);
    archive_entry_xattr_add_entry(local_80,"user.data1","ABCDEFG",7);
    archive_entry_xattr_add_entry(local_80,"user.data2","XYZ",3);
    iVar1 = archive_write_header(paVar5,local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'M',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar5);
    archive_entry_free(local_80);
    lVar6 = archive_write_data(paVar5,"12345678",9);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'O',8,"8",lVar6,"archive_write_data(a, \"12345678\", 9)",paVar5);
    local_80 = archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                     ,L'T',(uint)(local_80 != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_set_atime(local_80,2,0x14);
    archive_entry_set_ctime(local_80,4,0x28);
    archive_entry_set_mtime(local_80,5,0x32);
    archive_entry_copy_pathname(local_80,"file2");
    archive_entry_copy_symlink(local_80,"file");
    archive_entry_set_mode(local_80,0xa1ed);
    archive_entry_set_size(local_80,0);
    iVar1 = archive_write_header(paVar5,local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'\\',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar5);
    archive_entry_free(local_80);
    local_80 = archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                     ,L'b',(uint)(local_80 != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_set_atime(local_80,2,0x14);
    archive_entry_set_ctime(local_80,4,0x28);
    archive_entry_set_mtime(local_80,5,0x32);
    archive_entry_copy_pathname(local_80,"dir/file");
    archive_entry_set_mode(local_80,0x81ed);
    archive_entry_set_size(local_80,8);
    iVar1 = archive_write_header(paVar5,local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'i',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar5);
    archive_entry_free(local_80);
    lVar6 = archive_write_data(paVar5,"abcdefgh",9);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'k',8,"8",lVar6,"archive_write_data(a, \"abcdefgh\", 9)",paVar5);
    local_80 = archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                     ,L'p',(uint)(local_80 != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_set_atime(local_80,2,0x14);
    archive_entry_set_ctime(local_80,4,0x28);
    archive_entry_set_mtime(local_80,5,0x32);
    archive_entry_copy_pathname(local_80,"dir/dir2/file4");
    archive_entry_copy_hardlink(local_80,"file");
    archive_entry_set_mode(local_80,0x81ed);
    archive_entry_set_nlink(local_80,2);
    archive_entry_set_size(local_80,0);
    iVar1 = archive_write_header(paVar5,local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'y',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar5);
    archive_entry_free(local_80);
    local_80 = archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                     ,L'\x7f',(uint)(local_80 != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_set_atime(local_80,2,0x14);
    archive_entry_set_ctime(local_80,4,0x28);
    archive_entry_set_mtime(local_80,5,0x32);
    archive_entry_copy_pathname(local_80,"dir/dir3");
    archive_entry_set_mode(local_80,0x41ed);
    archive_entry_unset_size(local_80);
    iVar1 = archive_write_header(paVar5,local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'\x86',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar5);
    archive_entry_free(local_80);
    local_80 = archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                     ,L'\x8c',(uint)(local_80 != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_set_atime(local_80,2,0x14);
    archive_entry_set_ctime(local_80,4,0x28);
    archive_entry_set_mtime(local_80,5,0x32);
    archive_entry_copy_pathname(local_80,"dir/dir2/file4/wrong");
    archive_entry_set_mode(local_80,0x81ed);
    archive_entry_set_nlink(local_80,1);
    archive_entry_set_size(local_80,0);
    iVar1 = archive_write_header(paVar5,local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'\x94',-0x19,"ARCHIVE_FAILED",(long)iVar1,"archive_write_header(a, ae)",
                        paVar5);
    archive_entry_free(local_80);
    local_80 = archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                     ,L'\x9a',(uint)(local_80 != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_set_atime(local_80,2,0x14);
    archive_entry_set_ctime(local_80,4,0x28);
    archive_entry_set_mtime(local_80,5,0x32);
    archive_entry_copy_pathname_w(local_80,anon_var_dwarf_132591);
    archive_entry_set_mode(local_80,0x81ed);
    archive_entry_set_size(local_80,8);
    iVar1 = archive_write_header(paVar5,local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'¡',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar5);
    archive_entry_free(local_80);
    lVar6 = archive_write_data(paVar5,"ghijklmn",9);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'£',8,"8",lVar6,"archive_write_data(a, \"ghijklmn\", 9)",paVar5);
    iVar1 = archive_write_close(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'¬',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar5);
    iVar1 = archive_write_free(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'­',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",paVar5);
    paVar5 = archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                     ,L'´',(uint)(paVar5 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_read_support_format_all(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'µ',0,"0",(long)iVar1,"archive_read_support_format_all(a)",paVar5);
    iVar1 = archive_read_support_filter_all(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'¶',0,"0",(long)iVar1,"archive_read_support_filter_all(a)",paVar5);
    iVar1 = archive_read_open_memory(paVar5,buff,local_98);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'·',0,"0",(long)iVar1,"archive_read_open_memory(a, buff, used)",paVar5);
    iVar1 = archive_read_next_header(paVar5,&local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'¼',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",paVar5);
    tVar7 = archive_entry_atime(local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'½',2,"2",tVar7,"archive_entry_atime(ae)",(void *)0x0);
    lVar8 = archive_entry_atime_nsec(local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'¾',0,"0",lVar8,"archive_entry_atime_nsec(ae)",(void *)0x0);
    tVar7 = archive_entry_ctime(local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'¿',4,"4",tVar7,"archive_entry_ctime(ae)",(void *)0x0);
    lVar8 = archive_entry_ctime_nsec(local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'À',0,"0",lVar8,"archive_entry_ctime_nsec(ae)",(void *)0x0);
    tVar7 = archive_entry_mtime(local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'Á',5,"5",tVar7,"archive_entry_mtime(ae)",(void *)0x0);
    lVar8 = archive_entry_mtime_nsec(local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'Â',0,"0",lVar8,"archive_entry_mtime_nsec(ae)",(void *)0x0);
    pcVar9 = archive_entry_pathname(local_80);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
               ,L'Ã',"file","\"file\"",pcVar9,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
    mVar2 = archive_entry_mode(local_80);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                     ,L'Ä',(uint)(mVar2 == 0x81ed),"(AE_IFREG | 0755) == archive_entry_mode(ae)",
                     (void *)0x0);
    uVar3 = archive_entry_nlink(local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'Å',2,"2",(ulong)uVar3,"archive_entry_nlink(ae)",(void *)0x0);
    lVar10 = archive_entry_size(local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'Æ',8,"8",lVar10,"archive_entry_size(ae)",(void *)0x0);
    wVar4 = archive_entry_xattr_reset(local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'Ç',2,"2",(long)wVar4,"archive_entry_xattr_reset(ae)",(void *)0x0);
    wVar4 = archive_entry_xattr_next(local_80,&local_88,&local_90,&local_a0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'É',0,"ARCHIVE_OK",(long)wVar4,
                        "archive_entry_xattr_next(ae, &name, &value, &size)",(void *)0x0);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
               ,L'Ê',"user.data2","\"user.data2\"",local_88,"name",(void *)0x0,L'\0');
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'Ë',local_90,"value","XYZ","\"XYZ\"",3,"3",(void *)0x0);
    wVar4 = archive_entry_xattr_next(local_80,&local_88,&local_90,&local_a0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'Í',0,"ARCHIVE_OK",(long)wVar4,
                        "archive_entry_xattr_next(ae, &name, &value, &size)",(void *)0x0);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
               ,L'Î',"user.data1","\"user.data1\"",local_88,"name",(void *)0x0,L'\0');
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'Ï',local_90,"value","ABCDEFG","\"ABCDEFG\"",7,"7",(void *)0x0);
    lVar6 = archive_read_data(paVar5,local_78,10);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'Ð',8,"8",lVar6,"archive_read_data(a, buff2, 10)",paVar5);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'Ñ',local_78,"buff2","12345678","\"12345678\"",8,"8",(void *)0x0);
    iVar1 = archive_read_next_header(paVar5,&local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'Ö',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",paVar5);
    wVar4 = archive_entry_atime_is_set(local_80);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                     ,L'×',wVar4,"archive_entry_atime_is_set(ae)",(void *)0x0);
    tVar7 = archive_entry_atime(local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'Ø',2,"2",tVar7,"archive_entry_atime(ae)",(void *)0x0);
    lVar8 = archive_entry_atime_nsec(local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'Ù',0,"0",lVar8,"archive_entry_atime_nsec(ae)",(void *)0x0);
    wVar4 = archive_entry_ctime_is_set(local_80);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                     ,L'Ú',wVar4,"archive_entry_ctime_is_set(ae)",(void *)0x0);
    tVar7 = archive_entry_ctime(local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'Û',4,"4",tVar7,"archive_entry_ctime(ae)",(void *)0x0);
    lVar8 = archive_entry_ctime_nsec(local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'Ü',0,"0",lVar8,"archive_entry_ctime_nsec(ae)",(void *)0x0);
    wVar4 = archive_entry_mtime_is_set(local_80);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                     ,L'Ý',wVar4,"archive_entry_mtime_is_set(ae)",(void *)0x0);
    tVar7 = archive_entry_mtime(local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'Þ',5,"5",tVar7,"archive_entry_mtime(ae)",(void *)0x0);
    lVar8 = archive_entry_mtime_nsec(local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'ß',0,"0",lVar8,"archive_entry_mtime_nsec(ae)",(void *)0x0);
    pcVar9 = archive_entry_pathname(local_80);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
               ,L'à',"file2","\"file2\"",pcVar9,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
    pcVar9 = archive_entry_symlink(local_80);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
               ,L'á',"file","\"file\"",pcVar9,"archive_entry_symlink(ae)",(void *)0x0,L'\0');
    mVar2 = archive_entry_mode(local_80);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                     ,L'â',(uint)(mVar2 == 0xa1ed),"(AE_IFLNK | 0755) == archive_entry_mode(ae)",
                     (void *)0x0);
    lVar10 = archive_entry_size(local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'ã',0,"0",lVar10,"archive_entry_size(ae)",(void *)0x0);
    iVar1 = archive_read_next_header(paVar5,&local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'è',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",paVar5);
    tVar7 = archive_entry_atime(local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'é',2,"2",tVar7,"archive_entry_atime(ae)",(void *)0x0);
    lVar8 = archive_entry_atime_nsec(local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'ê',0,"0",lVar8,"archive_entry_atime_nsec(ae)",(void *)0x0);
    tVar7 = archive_entry_ctime(local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'ë',4,"4",tVar7,"archive_entry_ctime(ae)",(void *)0x0);
    lVar8 = archive_entry_ctime_nsec(local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'ì',0,"0",lVar8,"archive_entry_ctime_nsec(ae)",(void *)0x0);
    tVar7 = archive_entry_mtime(local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'í',5,"5",tVar7,"archive_entry_mtime(ae)",(void *)0x0);
    lVar8 = archive_entry_mtime_nsec(local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'î',0,"0",lVar8,"archive_entry_mtime_nsec(ae)",(void *)0x0);
    pcVar9 = archive_entry_pathname(local_80);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
               ,L'ï',"dir/file","\"dir/file\"",pcVar9,"archive_entry_pathname(ae)",(void *)0x0,
               L'\0');
    mVar2 = archive_entry_mode(local_80);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                     ,L'ð',(uint)(mVar2 == 0x81ed),"(AE_IFREG | 0755) == archive_entry_mode(ae)",
                     (void *)0x0);
    lVar10 = archive_entry_size(local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'ñ',8,"8",lVar10,"archive_entry_size(ae)",(void *)0x0);
    lVar6 = archive_read_data(paVar5,local_78,10);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'ò',8,"8",lVar6,"archive_read_data(a, buff2, 10)",paVar5);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'ó',local_78,"buff2","abcdefgh","\"abcdefgh\"",8,"8",(void *)0x0);
    iVar1 = archive_read_next_header(paVar5,&local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'ø',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",paVar5);
    wVar4 = archive_entry_atime_is_set(local_80);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                     ,L'ù',wVar4,"archive_entry_atime_is_set(ae)",(void *)0x0);
    tVar7 = archive_entry_atime(local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'ú',2,"2",tVar7,"archive_entry_atime(ae)",(void *)0x0);
    lVar8 = archive_entry_atime_nsec(local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'û',0,"0",lVar8,"archive_entry_atime_nsec(ae)",(void *)0x0);
    wVar4 = archive_entry_ctime_is_set(local_80);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                     ,L'ü',wVar4,"archive_entry_ctime_is_set(ae)",(void *)0x0);
    tVar7 = archive_entry_ctime(local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'ý',4,"4",tVar7,"archive_entry_ctime(ae)",(void *)0x0);
    lVar8 = archive_entry_ctime_nsec(local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'þ',0,"0",lVar8,"archive_entry_ctime_nsec(ae)",(void *)0x0);
    wVar4 = archive_entry_mtime_is_set(local_80);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                     ,L'ÿ',wVar4,"archive_entry_mtime_is_set(ae)",(void *)0x0);
    tVar7 = archive_entry_mtime(local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'Ā',5,"5",tVar7,"archive_entry_mtime(ae)",(void *)0x0);
    lVar8 = archive_entry_mtime_nsec(local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'ā',0,"0",lVar8,"archive_entry_mtime_nsec(ae)",(void *)0x0);
    pcVar9 = archive_entry_pathname(local_80);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
               ,L'Ă',"dir/dir2/file4","\"dir/dir2/file4\"",pcVar9,"archive_entry_pathname(ae)",
               (void *)0x0,L'\0');
    pcVar9 = archive_entry_hardlink(local_80);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
               ,L'ă',"file","\"file\"",pcVar9,"archive_entry_hardlink(ae)",(void *)0x0,L'\0');
    mVar2 = archive_entry_mode(local_80);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                     ,L'Ą',(uint)(mVar2 == 0x81ed),"(AE_IFREG | 0755) == archive_entry_mode(ae)",
                     (void *)0x0);
    uVar3 = archive_entry_nlink(local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'ą',2,"2",(ulong)uVar3,"archive_entry_nlink(ae)",(void *)0x0);
    lVar10 = archive_entry_size(local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'Ć',0,"0",lVar10,"archive_entry_size(ae)",(void *)0x0);
    iVar1 = archive_read_next_header(paVar5,&local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'ċ',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",paVar5);
    wVar4 = archive_entry_atime_is_set(local_80);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                     ,L'Č',wVar4,"archive_entry_atime_is_set(ae)",(void *)0x0);
    tVar7 = archive_entry_atime(local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'č',2,"2",tVar7,"archive_entry_atime(ae)",(void *)0x0);
    lVar8 = archive_entry_atime_nsec(local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'Ď',0,"0",lVar8,"archive_entry_atime_nsec(ae)",(void *)0x0);
    wVar4 = archive_entry_ctime_is_set(local_80);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                     ,L'ď',wVar4,"archive_entry_ctime_is_set(ae)",(void *)0x0);
    tVar7 = archive_entry_ctime(local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'Đ',4,"4",tVar7,"archive_entry_ctime(ae)",(void *)0x0);
    lVar8 = archive_entry_ctime_nsec(local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'đ',0,"0",lVar8,"archive_entry_ctime_nsec(ae)",(void *)0x0);
    wVar4 = archive_entry_mtime_is_set(local_80);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                     ,L'Ē',wVar4,"archive_entry_mtime_is_set(ae)",(void *)0x0);
    tVar7 = archive_entry_mtime(local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'ē',5,"5",tVar7,"archive_entry_mtime(ae)",(void *)0x0);
    lVar8 = archive_entry_mtime_nsec(local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'Ĕ',0,"0",lVar8,"archive_entry_mtime_nsec(ae)",(void *)0x0);
    pcVar9 = archive_entry_pathname(local_80);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
               ,L'ĕ',"dir/dir3","\"dir/dir3\"",pcVar9,"archive_entry_pathname(ae)",(void *)0x0,
               L'\0');
    mVar2 = archive_entry_mode(local_80);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                     ,L'Ė',(uint)(mVar2 == 0x41ed),"(AE_IFDIR | 0755) == archive_entry_mode(ae)",
                     (void *)0x0);
    iVar1 = archive_read_next_header(paVar5,&local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'ě',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",paVar5);
    tVar7 = archive_entry_atime(local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'Ĝ',2,"2",tVar7,"archive_entry_atime(ae)",(void *)0x0);
    lVar8 = archive_entry_atime_nsec(local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'ĝ',0,"0",lVar8,"archive_entry_atime_nsec(ae)",(void *)0x0);
    tVar7 = archive_entry_ctime(local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'Ğ',4,"4",tVar7,"archive_entry_ctime(ae)",(void *)0x0);
    lVar8 = archive_entry_ctime_nsec(local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'ğ',0,"0",lVar8,"archive_entry_ctime_nsec(ae)",(void *)0x0);
    tVar7 = archive_entry_mtime(local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'Ġ',5,"5",tVar7,"archive_entry_mtime(ae)",(void *)0x0);
    lVar8 = archive_entry_mtime_nsec(local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'ġ',0,"0",lVar8,"archive_entry_mtime_nsec(ae)",(void *)0x0);
    v2 = archive_entry_pathname_w(local_80);
    assertion_equal_wstring
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
               ,L'Ģ',anon_var_dwarf_132591,"L\"dir/file\\U0001F574\"",v2,
               "archive_entry_pathname_w(ae)",(void *)0x0);
    mVar2 = archive_entry_mode(local_80);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                     ,L'ģ',(uint)(mVar2 == 0x81ed),"(AE_IFREG | 0755) == archive_entry_mode(ae)",
                     (void *)0x0);
    lVar10 = archive_entry_size(local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'Ĥ',8,"8",lVar10,"archive_entry_size(ae)",(void *)0x0);
    lVar6 = archive_read_data(paVar5,local_78,10);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'ĥ',8,"8",lVar6,"archive_read_data(a, buff2, 10)",paVar5);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'Ħ',local_78,"buff2","ghijklmn","\"ghijklmn\"",8,"8",(void *)0x0);
    iVar1 = archive_read_next_header(paVar5,&local_80);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'ī',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",paVar5
                       );
    iVar1 = archive_read_close(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'Ĭ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar5);
    iVar1 = archive_read_free(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,L'ĭ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",paVar5);
    free(buff);
  }
  else {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                   ,L'.');
    test_skipping("xar is not supported on this platform");
    iVar1 = archive_write_free(paVar5);
    wVar4 = L'/';
LAB_00204889:
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_xar.c"
                        ,wVar4,0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",paVar5);
  }
  return;
}

Assistant:

static void
test_xar(const char *option)
{
	char buff2[64];
	size_t buffsize = 1500;
	char *buff;
	struct archive_entry *ae;
	struct archive *a;
	size_t used;
	const char *name;
	const void *value;
	size_t size;

	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	if (archive_write_set_format_xar(a) != ARCHIVE_OK) {
		skipping("xar is not supported on this platform");
		assertEqualIntA(a, ARCHIVE_OK, archive_write_free(a));
		return;
	}
	assertA(0 == archive_write_add_filter_none(a));
	if (option != NULL &&
	    archive_write_set_options(a, option) != ARCHIVE_OK) {
		skipping("option `%s` is not supported on this platform", option);
		assertEqualIntA(a, ARCHIVE_OK, archive_write_free(a));
		return;
	}

	buff = malloc(buffsize);
	assert(buff != NULL);

	assertA(0 == archive_write_open_memory(a, buff, buffsize, &used));

	/*
	 * "file" has a bunch of attributes and 8 bytes of data and
	 * 7 bytes of xattr data and 3 bytes of xattr.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_atime(ae, 2, 20);
	archive_entry_set_ctime(ae, 4, 40);
	archive_entry_set_mtime(ae, 5, 50);
	archive_entry_copy_pathname(ae, "file");
	archive_entry_set_mode(ae, AE_IFREG | 0755);
	archive_entry_set_nlink(ae, 2);
	archive_entry_set_size(ae, 8);
	archive_entry_xattr_add_entry(ae, "user.data1", "ABCDEFG", 7);
	archive_entry_xattr_add_entry(ae, "user.data2", "XYZ", 3);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualIntA(a, 8, archive_write_data(a, "12345678", 9));

	/*
	 * "file2" is symbolic link to file
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_atime(ae, 2, 20);
	archive_entry_set_ctime(ae, 4, 40);
	archive_entry_set_mtime(ae, 5, 50);
	archive_entry_copy_pathname(ae, "file2");
	archive_entry_copy_symlink(ae, "file");
	archive_entry_set_mode(ae, AE_IFLNK | 0755);
	archive_entry_set_size(ae, 0);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);

	/*
	 * "dir/file3" has a bunch of attributes and 8 bytes of data.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_atime(ae, 2, 20);
	archive_entry_set_ctime(ae, 4, 40);
	archive_entry_set_mtime(ae, 5, 50);
	archive_entry_copy_pathname(ae, "dir/file");
	archive_entry_set_mode(ae, AE_IFREG | 0755);
	archive_entry_set_size(ae, 8);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualIntA(a, 8, archive_write_data(a, "abcdefgh", 9));

	/*
	 * "dir/dir2/file4" is hard link to file
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_atime(ae, 2, 20);
	archive_entry_set_ctime(ae, 4, 40);
	archive_entry_set_mtime(ae, 5, 50);
	archive_entry_copy_pathname(ae, "dir/dir2/file4");
	archive_entry_copy_hardlink(ae, "file");
	archive_entry_set_mode(ae, AE_IFREG | 0755);
	archive_entry_set_nlink(ae, 2);
	archive_entry_set_size(ae, 0);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);

	/*
	 * "dir/dir3" is a directory
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_atime(ae, 2, 20);
	archive_entry_set_ctime(ae, 4, 40);
	archive_entry_set_mtime(ae, 5, 50);
	archive_entry_copy_pathname(ae, "dir/dir3");
	archive_entry_set_mode(ae, AE_IFDIR | 0755);
	archive_entry_unset_size(ae);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);

	/*
	 * Add a wrong path "dir/dir2/file4/wrong"
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_atime(ae, 2, 20);
	archive_entry_set_ctime(ae, 4, 40);
	archive_entry_set_mtime(ae, 5, 50);
	archive_entry_copy_pathname(ae, "dir/dir2/file4/wrong");
	archive_entry_set_mode(ae, AE_IFREG | 0755);
	archive_entry_set_nlink(ae, 1);
	archive_entry_set_size(ae, 0);
	assertEqualIntA(a, ARCHIVE_FAILED, archive_write_header(a, ae));
	archive_entry_free(ae);

	/*
	 * "dir/file{UNICODE}" has a name that requires base64 encoding
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_atime(ae, 2, 20);
	archive_entry_set_ctime(ae, 4, 40);
	archive_entry_set_mtime(ae, 5, 50);
	archive_entry_copy_pathname_w(ae, L"dir/file\U0001F574");
	archive_entry_set_mode(ae, AE_IFREG | 0755);
	archive_entry_set_size(ae, 8);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualIntA(a, 8, archive_write_data(a, "ghijklmn", 9));

	/*
	 * XXX TODO XXX Archive directory, other file types.
	 * Archive extended attributes, ACLs, other metadata.
	 * Verify they get read back correctly.
	 */

	/* Close out the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_free(a));

	/*
	 *
	 * Now, read the data back.
	 *
	 */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, 0, archive_read_support_format_all(a));
	assertEqualIntA(a, 0, archive_read_support_filter_all(a));
	assertEqualIntA(a, 0, archive_read_open_memory(a, buff, used));

	/*
	 * Read "file"
	 */
	assertEqualIntA(a, 0, archive_read_next_header(a, &ae));
	assertEqualInt(2, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_atime_nsec(ae));
	assertEqualInt(4, archive_entry_ctime(ae));
	assertEqualInt(0, archive_entry_ctime_nsec(ae));
	assertEqualInt(5, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualString("file", archive_entry_pathname(ae));
	assert((AE_IFREG | 0755) == archive_entry_mode(ae));
	assertEqualInt(2, archive_entry_nlink(ae));
	assertEqualInt(8, archive_entry_size(ae));
	assertEqualInt(2, archive_entry_xattr_reset(ae));
	assertEqualInt(ARCHIVE_OK,
	    archive_entry_xattr_next(ae, &name, &value, &size));
	assertEqualString("user.data2", name);
	assertEqualMem(value, "XYZ", 3);
	assertEqualInt(ARCHIVE_OK,
	    archive_entry_xattr_next(ae, &name, &value, &size));
	assertEqualString("user.data1", name);
	assertEqualMem(value, "ABCDEFG", 7);
	assertEqualIntA(a, 8, archive_read_data(a, buff2, 10));
	assertEqualMem(buff2, "12345678", 8);

	/*
	 * Read "file2"
	 */
	assertEqualIntA(a, 0, archive_read_next_header(a, &ae));
	assert(archive_entry_atime_is_set(ae));
	assertEqualInt(2, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_atime_nsec(ae));
	assert(archive_entry_ctime_is_set(ae));
	assertEqualInt(4, archive_entry_ctime(ae));
	assertEqualInt(0, archive_entry_ctime_nsec(ae));
	assert(archive_entry_mtime_is_set(ae));
	assertEqualInt(5, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualString("file2", archive_entry_pathname(ae));
	assertEqualString("file", archive_entry_symlink(ae));
	assert((AE_IFLNK | 0755) == archive_entry_mode(ae));
	assertEqualInt(0, archive_entry_size(ae));

	/*
	 * Read "dir/file3"
	 */
	assertEqualIntA(a, 0, archive_read_next_header(a, &ae));
	assertEqualInt(2, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_atime_nsec(ae));
	assertEqualInt(4, archive_entry_ctime(ae));
	assertEqualInt(0, archive_entry_ctime_nsec(ae));
	assertEqualInt(5, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualString("dir/file", archive_entry_pathname(ae));
	assert((AE_IFREG | 0755) == archive_entry_mode(ae));
	assertEqualInt(8, archive_entry_size(ae));
	assertEqualIntA(a, 8, archive_read_data(a, buff2, 10));
	assertEqualMem(buff2, "abcdefgh", 8);

	/*
	 * Read "dir/dir2/file4"
	 */
	assertEqualIntA(a, 0, archive_read_next_header(a, &ae));
	assert(archive_entry_atime_is_set(ae));
	assertEqualInt(2, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_atime_nsec(ae));
	assert(archive_entry_ctime_is_set(ae));
	assertEqualInt(4, archive_entry_ctime(ae));
	assertEqualInt(0, archive_entry_ctime_nsec(ae));
	assert(archive_entry_mtime_is_set(ae));
	assertEqualInt(5, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualString("dir/dir2/file4", archive_entry_pathname(ae));
	assertEqualString("file", archive_entry_hardlink(ae));
	assert((AE_IFREG | 0755) == archive_entry_mode(ae));
	assertEqualInt(2, archive_entry_nlink(ae));
	assertEqualInt(0, archive_entry_size(ae));

	/*
	 * Read "dir/dir3"
	 */
	assertEqualIntA(a, 0, archive_read_next_header(a, &ae));
	assert(archive_entry_atime_is_set(ae));
	assertEqualInt(2, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_atime_nsec(ae));
	assert(archive_entry_ctime_is_set(ae));
	assertEqualInt(4, archive_entry_ctime(ae));
	assertEqualInt(0, archive_entry_ctime_nsec(ae));
	assert(archive_entry_mtime_is_set(ae));
	assertEqualInt(5, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualString("dir/dir3", archive_entry_pathname(ae));
	assert((AE_IFDIR | 0755) == archive_entry_mode(ae));

	/*
	 * Read "dir/file{UNICODE}"
	 */
	assertEqualIntA(a, 0, archive_read_next_header(a, &ae));
	assertEqualInt(2, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_atime_nsec(ae));
	assertEqualInt(4, archive_entry_ctime(ae));
	assertEqualInt(0, archive_entry_ctime_nsec(ae));
	assertEqualInt(5, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualWString(L"dir/file\U0001F574", archive_entry_pathname_w(ae));
	assert((AE_IFREG | 0755) == archive_entry_mode(ae));
	assertEqualInt(8, archive_entry_size(ae));
	assertEqualIntA(a, 8, archive_read_data(a, buff2, 10));
	assertEqualMem(buff2, "ghijklmn", 8);

	/*
	 * Verify the end of the archive.
	 */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_free(a));

	free(buff);
}